

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# room.cc
# Opt level: O0

int GetObjectTileMask(uint8_t object)

{
  int local_c;
  uint8_t object_local;
  
  switch(object) {
  case 'e':
    local_c = 0x40;
    break;
  case 'f':
    local_c = 0x42;
    break;
  default:
    local_c = 0;
    break;
  case 'n':
    local_c = 0x45;
    break;
  case 'o':
    local_c = 0x46;
    break;
  case 'p':
    local_c = 0x47;
    break;
  case 'q':
    local_c = 0x41;
    break;
  case 's':
    local_c = 0x48;
    break;
  case 't':
    local_c = 0x49;
    break;
  case 'v':
    local_c = 0x53;
    break;
  case 'w':
    local_c = 0x51;
  }
  return local_c;
}

Assistant:

int GetObjectTileMask(uint8_t object) {
  switch (object) {
    case 'e':  // Treasure chest
      return 64;
    case 'f':  // Smoke
      return 66;
    case 'n':  // Old body
      return 69;
    case 'o':  // Old bones
      return 70;
    case 'p':  // Old stone coffin
      return 71;
    case 'q':  // Old grave
      return 65;
    case 's':  // Old skeleton
      return 72;
    case 't':  // Old skeleton
      return 73;
    case 'v':  // Just some blood
      return 83;
    case 'w':  // Stone marker
      return 81;
  }

  return 0;
}